

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_pop_level(Parser *this)

{
  Tree *pTVar1;
  ulong uVar2;
  State *pSVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  bool bVar7;
  size_t sVar8;
  State *pSVar9;
  char msg [35];
  char local_68 [64];
  char *pcStack_28;
  undefined8 local_20;
  
  if ((this->m_state->flags & 4) == 0) {
    pTVar1 = this->m_tree;
    uVar2 = this->m_state->node_id;
    if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_68[0] = '\0';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = -0x7a;
      local_68[9] = 'K';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      local_68[0x18] = -0x78;
      local_68[0x19] = 'B';
      local_68[0x1a] = '!';
      local_68[0x1b] = '\0';
      local_68[0x1c] = '\0';
      local_68[0x1d] = '\0';
      local_68[0x1e] = '\0';
      local_68[0x1f] = '\0';
      local_68[0x20] = 'e';
      local_68[0x21] = '\0';
      local_68[0x22] = '\0';
      local_68[0x23] = '\0';
      local_68[0x24] = '\0';
      local_68[0x25] = '\0';
      local_68[0x26] = '\0';
      local_68[0x27] = '\0';
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[uVar2].m_type.type & MAP) != NOTYPE) goto LAB_001e19c9;
  }
  else {
LAB_001e19c9:
    _stop_map(this);
  }
  if ((this->m_state->flags & 8) == 0) {
    pTVar1 = this->m_tree;
    uVar2 = this->m_state->node_id;
    if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_68[0] = '\0';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = -0x7a;
      local_68[9] = 'K';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      local_68[0x18] = -0x78;
      local_68[0x19] = 'B';
      local_68[0x1a] = '!';
      local_68[0x1b] = '\0';
      local_68[0x1c] = '\0';
      local_68[0x1d] = '\0';
      local_68[0x1e] = '\0';
      local_68[0x1f] = '\0';
      local_68[0x20] = 'e';
      local_68[0x21] = '\0';
      local_68[0x22] = '\0';
      local_68[0x23] = '\0';
      local_68[0x24] = '\0';
      local_68[0x25] = '\0';
      local_68[0x26] = '\0';
      local_68[0x27] = '\0';
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[uVar2].m_type.type & SEQ) == NOTYPE) goto LAB_001e1a81;
  }
  _stop_seq(this);
LAB_001e1a81:
  pTVar1 = this->m_tree;
  uVar2 = this->m_state->node_id;
  if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = -0x7a;
    local_68[9] = 'K';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[0x18] = -0x78;
    local_68[0x19] = 'B';
    local_68[0x1a] = '!';
    local_68[0x1b] = '\0';
    local_68[0x1c] = '\0';
    local_68[0x1d] = '\0';
    local_68[0x1e] = '\0';
    local_68[0x1f] = '\0';
    local_68[0x20] = 'e';
    local_68[0x21] = '\0';
    local_68[0x22] = '\0';
    local_68[0x23] = '\0';
    local_68[0x24] = '\0';
    local_68[0x25] = '\0';
    local_68[0x26] = '\0';
    local_68[0x27] = '\0';
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[uVar2].m_type.type & DOC) != NOTYPE) {
    _stop_doc(this);
  }
  if ((this->m_stack).m_size < 2) {
    builtin_strncpy(local_68,"check failed: (m_stack.size() > 1)",0x23);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_68[0x28] = '\0';
    local_68[0x29] = '\0';
    local_68[0x2a] = '\0';
    local_68[0x2b] = '\0';
    local_68[0x2c] = '\0';
    local_68[0x2d] = '\0';
    local_68[0x2e] = '\0';
    local_68[0x2f] = '\0';
    local_68[0x30] = 'B';
    local_68[0x31] = 'w';
    local_68[0x32] = '\0';
    local_68[0x33] = '\0';
    local_68[0x34] = '\0';
    local_68[0x35] = '\0';
    local_68[0x36] = '\0';
    local_68[0x37] = '\0';
    local_68[0x38] = '\0';
    local_68[0x39] = '\0';
    local_68[0x3a] = '\0';
    local_68[0x3b] = '\0';
    local_68[0x3c] = '\0';
    local_68[0x3d] = '\0';
    local_68[0x3e] = '\0';
    local_68[0x3f] = '\0';
    pcStack_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_20 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x7742) << 0x40);
    LVar5.name.str._0_4_ = 0x214288;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x23,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  _prepare_pop(this);
  detail::stack<c4::yml::Parser::State,_16UL>::pop(&this->m_stack);
  sVar8 = (this->m_stack).m_size;
  if (sVar8 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\\';
    local_68[9] = '\\';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[0x18] = -0x78;
    local_68[0x19] = 'B';
    local_68[0x1a] = '!';
    local_68[0x1b] = '\0';
    local_68[0x1c] = '\0';
    local_68[0x1d] = '\0';
    local_68[0x1e] = '\0';
    local_68[0x1f] = '\0';
    local_68[0x20] = 'e';
    local_68[0x21] = '\0';
    local_68[0x22] = '\0';
    local_68[0x23] = '\0';
    local_68[0x24] = '\0';
    local_68[0x25] = '\0';
    local_68[0x26] = '\0';
    local_68[0x27] = '\0';
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar8 = (this->m_stack).m_size;
  }
  pSVar3 = (this->m_stack).m_stack;
  pSVar9 = pSVar3 + (sVar8 - 1);
  this->m_state = pSVar9;
  if (pSVar3[sVar8 - 1].line_contents.indentation == 0) {
    *(byte *)&pSVar9->flags = (byte)pSVar9->flags | 1;
  }
  return;
}

Assistant:

void Parser::_pop_level()
{
    _c4dbgpf("popping level! currnode={} currlevel={}", m_state->node_id, m_state->level);
    if(has_any(RMAP) || m_tree->is_map(m_state->node_id))
    {
        _stop_map();
    }
    if(has_any(RSEQ) || m_tree->is_seq(m_state->node_id))
    {
        _stop_seq();
    }
    if(m_tree->is_doc(m_state->node_id))
    {
        _stop_doc();
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.size() > 1);
    _prepare_pop();
    m_stack.pop();
    m_state = &m_stack.top();
    /*if(has_any(RMAP))
    {
        _toggle_key_val();
    }*/
    if(m_state->line_contents.indentation == 0)
    {
        //_RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RTOP));
        add_flags(RTOP);
    }
    _c4dbgpf("popping level: now, currnode={} currlevel={}", m_state->node_id, m_state->level);
}